

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TensorUtils.hpp
# Opt level: O2

uint64_t __thiscall scp::TensorShape::getIndex(TensorShape *this,uint64_t *indices)

{
  ulong *puVar1;
  ulong *puVar2;
  uint64_t uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  do {
    if (this->order == uVar4) {
      uVar3 = *indices;
      for (uVar4 = 1; uVar4 < this->order; uVar4 = uVar4 + 1) {
        uVar3 = uVar3 * this->sizes[uVar4] + indices[uVar4];
      }
      return uVar3;
    }
    puVar1 = indices + uVar4;
    puVar2 = this->sizes + uVar4;
    uVar4 = uVar4 + 1;
  } while (*puVar1 < *puVar2);
  __assert_fail("indices[i] < sizes[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Reiex[P]SciPP/include/SciPP/Core/templates/TensorUtils.hpp"
                ,0x77,"uint64_t scp::TensorShape::getIndex(const uint64_t *) const");
}

Assistant:

constexpr uint64_t TensorShape::getIndex(const uint64_t* indices) const
	{
		for (uint64_t i = 0; i < order; ++i)
		{
			assert(indices[i] < sizes[i]);
		}

		uint64_t result = indices[0];
		for (uint64_t i = 1; i < order; ++i)
		{
			result = result * sizes[i] + indices[i];
		}

		return result;
	}